

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestParser.cpp
# Opt level: O0

void __thiscall TestParser_TestOrExpr_Test::TestBody(TestParser_TestOrExpr_Test *this)

{
  bool bVar1;
  pointer pSVar2;
  pointer pEVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  _Head_base<0UL,_AST::Expr_*,_false> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  _Head_base<0UL,_AST::Expr_*,_false> local_198;
  AssertHelper local_180;
  Message local_178;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_2;
  Message local_158;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_1;
  Identifier *rident;
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> right;
  Identifier *lident;
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> left;
  AssertHelper local_118;
  Message local_110;
  TokenType local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar;
  BinaryExpr *orExpr;
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> expr;
  ExprStmt *exprStmt;
  unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_> stmt;
  allocator<char> local_b9;
  string local_b8;
  Lexer local_98;
  undefined1 local_68 [8];
  Parser parser;
  TestParser_TestOrExpr_Test *this_local;
  
  parser.m_currToken.literal.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"a or b",&local_b9);
  Lexer::Lexer(&local_98,&local_b8);
  Parser::Parser((Parser *)local_68,&local_98);
  Lexer::~Lexer(&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  Parser::parse((Parser *)&exprStmt);
  pSVar2 = std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>::get
                     ((unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_> *)&exprStmt);
  if (pSVar2 == (pointer)0x0) {
    local_198._M_head_impl = (Expr *)0x0;
  }
  else {
    local_198._M_head_impl =
         (Expr *)__dynamic_cast(pSVar2,&AST::Stmt::typeinfo,&AST::ExprStmt::typeinfo,0);
  }
  expr._M_t.super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>._M_t.
  super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
  super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl =
       (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)
       (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)
       local_198._M_head_impl;
  std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>::unique_ptr
            ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)&orExpr,
             (unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)(local_198._M_head_impl + 1))
  ;
  pEVar3 = std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>::get
                     ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)&orExpr);
  if (pEVar3 == (pointer)0x0) {
    local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __dynamic_cast(pEVar3,&AST::Expr::typeinfo,&AST::BinaryExpr::typeinfo,0);
  }
  gtest_ar.message_.ptr_ = local_1a8;
  local_104 = Or;
  testing::internal::EqHelper<false>::Compare<TokenType,TokenType>
            ((EqHelper<false> *)local_100,"orExpr->m_op","TokenType::Or",
             (TokenType *)&local_1a8->_M_string_length,&local_104);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ubclaunchpad[P]durian/test/TestParser.cpp"
               ,0xcc,pcVar4);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    testing::Message::~Message(&local_110);
  }
  left._M_t.super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>._M_t.
  super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
  super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl._5_3_ = 0;
  left._M_t.super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>._M_t.
  super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
  super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  if (left._M_t.super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>._M_t.
      super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
      super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl._4_4_ == 0) {
    std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>::unique_ptr
              ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)&lident,
               (unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)
               &((gtest_ar.message_.ptr_)->field_2)._M_allocated_capacity);
    pEVar3 = std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>::get
                       ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)&lident);
    if (pEVar3 == (pointer)0x0) {
      local_1c8._M_head_impl = (Expr *)0x0;
    }
    else {
      local_1c8._M_head_impl =
           (Expr *)__dynamic_cast(pEVar3,&AST::Expr::typeinfo,&AST::Identifier::typeinfo,0);
    }
    right._M_t.super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>._M_t.
    super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
    super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl =
         (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)
         (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)
         local_1c8._M_head_impl;
    std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>::unique_ptr
              ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)&rident,
               (unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)
               ((long)&(gtest_ar.message_.ptr_)->field_2 + 8));
    pEVar3 = std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>::get
                       ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)&rident);
    if (pEVar3 == (pointer)0x0) {
      local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    else {
      local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  __dynamic_cast(pEVar3,&AST::Expr::typeinfo,&AST::Identifier::typeinfo,0);
    }
    gtest_ar_1.message_.ptr_ = local_1d8;
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[2]>
              ((EqHelper<false> *)local_150,"lident->m_identStr","\"a\"",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)right._M_t.super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>.
                      _M_t.super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
                      super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl + 8),
               (char (*) [2])0x1f1fe8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
    if (!bVar1) {
      testing::Message::Message(&local_158);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/ubclaunchpad[P]durian/test/TestParser.cpp"
                 ,0xd1,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_158);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_158);
    }
    left._M_t.super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>._M_t.
    super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
    super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl._5_3_ = 0;
    left._M_t.super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>._M_t.
    super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
    super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
    if (left._M_t.super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>._M_t.
        super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
        super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl._4_4_ == 0) {
      testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[2]>
                ((EqHelper<false> *)local_170,"rident->m_identStr","\"b\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(gtest_ar_1.message_.ptr_)->_M_string_length,(char (*) [2])0x1f2179);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
      if (!bVar1) {
        testing::Message::Message(&local_178);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
        testing::internal::AssertHelper::AssertHelper
                  (&local_180,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/ubclaunchpad[P]durian/test/TestParser.cpp"
                   ,0xd2,pcVar4);
        testing::internal::AssertHelper::operator=(&local_180,&local_178);
        testing::internal::AssertHelper::~AssertHelper(&local_180);
        testing::Message::~Message(&local_178);
      }
      left._M_t.super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>._M_t.
      super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
      super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl._5_3_ = 0;
      left._M_t.super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>._M_t.
      super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
      super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
      if (left._M_t.super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>._M_t.
          super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
          super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl._4_4_ == 0) {
        left._M_t.super___uniq_ptr_impl<AST::Expr,_std::default_delete<AST::Expr>_>._M_t.
        super__Tuple_impl<0UL,_AST::Expr_*,_std::default_delete<AST::Expr>_>.
        super__Head_base<0UL,_AST::Expr_*,_false>._M_head_impl._4_4_ = 0;
      }
    }
    std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>::~unique_ptr
              ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)&rident);
    std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>::~unique_ptr
              ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)&lident);
  }
  std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>::~unique_ptr
            ((unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)&orExpr);
  std::unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_>::~unique_ptr
            ((unique_ptr<AST::Stmt,_std::default_delete<AST::Stmt>_> *)&exprStmt);
  Parser::~Parser((Parser *)local_68);
  return;
}

Assistant:

TEST(TestParser, TestOrExpr) {
    Parser parser(Lexer("a or b"));
    std::unique_ptr<AST::Stmt> stmt = parser.parse();
    auto* exprStmt = dynamic_cast<AST::ExprStmt*>(stmt.get());
    std::unique_ptr<AST::Expr> expr = std::move(exprStmt->m_expr);
    auto* orExpr = dynamic_cast<AST::BinaryExpr*>(expr.get());
    ASSERT_EQ(orExpr->m_op, TokenType::Or);
    std::unique_ptr<AST::Expr> left = std::move(orExpr->m_left);
    auto* lident = dynamic_cast<AST::Identifier*>(left.get());
    std::unique_ptr<AST::Expr> right = std::move(orExpr->m_right);
    auto* rident = dynamic_cast<AST::Identifier*>(right.get());
    ASSERT_EQ(lident->m_identStr, "a");
    ASSERT_EQ(rident->m_identStr, "b");
}